

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

bool __thiscall cmFindBase::CheckForVariableInCache(cmFindBase *this)

{
  string *name;
  bool bVar1;
  CacheEntryType CVar2;
  char *val;
  cmState *this_00;
  char *pcVar3;
  allocator local_51;
  string local_50;
  
  name = &this->VariableName;
  val = cmMakefile::GetDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,name);
  if (val != (char *)0x0) {
    this_00 = cmMakefile::GetState((this->super_cmFindCommon).super_cmCommand.Makefile);
    pcVar3 = cmState::GetCacheEntryValue(this_00,name);
    bVar1 = cmSystemTools::IsNOTFOUND(val);
    if (!bVar1) {
      if (pcVar3 == (char *)0x0) {
        return true;
      }
      CVar2 = cmState::GetCacheEntryType(this_00,name);
      if (CVar2 != UNINITIALIZED) {
        return true;
      }
      this->AlreadyInCacheWithoutMetaInfo = true;
      return true;
    }
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_50,"HELPSTRING",&local_51);
      cmState::GetCacheEntryProperty(this_00,name,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::assign((char *)&this->VariableDocumentation);
    }
  }
  return false;
}

Assistant:

bool cmFindBase::CheckForVariableInCache()
{
  if(const char* cacheValue =
     this->Makefile->GetDefinition(this->VariableName))
    {
    cmState* state = this->Makefile->GetState();
    const char* cacheEntry = state->GetCacheEntryValue(this->VariableName);
    bool found = !cmSystemTools::IsNOTFOUND(cacheValue);
    bool cached = cacheEntry ? true : false;
    if(found)
      {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the
      // original value.  Tell the subclass implementations to do
      // this.
      if(cached && state->GetCacheEntryType(this->VariableName)
                                            == cmState::UNINITIALIZED)
        {
        this->AlreadyInCacheWithoutMetaInfo = true;
        }
      return true;
      }
    else if(cached)
      {
      const char* hs = state->GetCacheEntryProperty(this->VariableName,
                                                     "HELPSTRING");
      this->VariableDocumentation = hs?hs:"(none)";
      }
    }
  return false;
}